

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

opj_tgt_tree_t * tgt_create_v2(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node *poVar3;
  uint uVar4;
  opj_tgt_tree_t *poVar5;
  opj_tgt_node_t *__s;
  ulong uVar6;
  opj_tgt_node_t *poVar7;
  uint uVar8;
  opj_tgt_node *poVar9;
  opj_tgt_node *poVar10;
  int iVar11;
  uint uVar12;
  OPJ_UINT32 *pOVar13;
  uint uVar14;
  ulong uVar15;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  OPJ_UINT32 local_138 [32];
  OPJ_UINT32 local_b8 [34];
  
  poVar5 = (opj_tgt_tree_t *)malloc(0x20);
  if (poVar5 == (opj_tgt_tree_t *)0x0) {
    tgt_create_v2_cold_3();
  }
  else {
    poVar5->numleafsh = 0;
    poVar5->numleafsv = 0;
    *(undefined8 *)&poVar5->numnodes = 0;
    poVar5->nodes = (opj_tgt_node_t *)0x0;
    *(undefined8 *)&poVar5->nodes_size = 0;
    poVar5->numleafsh = numleafsh;
    poVar5->numleafsv = numleafsv;
    local_b8[0] = numleafsh;
    local_138[0] = numleafsv;
    poVar5->numnodes = 0;
    uVar15 = 0xffffffff;
    uVar4 = 0;
    do {
      uVar12 = uVar4;
      iVar11 = (int)uVar15;
      uVar14 = iVar11 + 1;
      uVar15 = (ulong)uVar14;
      OVar1 = local_b8[uVar15];
      OVar2 = local_138[uVar15];
      uVar8 = OVar2 * OVar1;
      uVar4 = iVar11 + 2;
      local_b8[uVar4] = (int)((OVar1 - ((int)(OVar1 + 1) >> 0x1f)) + 1) >> 1;
      local_138[uVar4] = (int)((OVar2 - ((int)(OVar2 + 1) >> 0x1f)) + 1) >> 1;
      uVar4 = uVar12 + uVar8;
    } while (1 < uVar8);
    poVar5->numnodes = uVar4;
    if (uVar4 == 0) {
      tgt_create_v2_cold_2();
    }
    else {
      __s = (opj_tgt_node_t *)calloc((ulong)uVar4,0x18);
      poVar5->nodes = __s;
      if (__s != (opj_tgt_node_t *)0x0) {
        memset(__s,0,(ulong)uVar4 * 0x18);
        poVar5->nodes_size = uVar4 * 0x18;
        poVar7 = __s;
        if (uVar14 != 0) {
          poVar9 = __s + numleafsv * numleafsh;
          uVar6 = 0;
          poVar10 = poVar9;
          do {
            OVar1 = local_138[uVar6];
            if (0 < (int)OVar1) {
              OVar2 = local_b8[uVar6];
              uVar4 = 0;
              do {
                iVar11 = OVar2 + 2;
                if (0 < (int)OVar2) {
                  do {
                    poVar7->parent = poVar10;
                    if (iVar11 == 3) {
                      poVar7 = poVar7 + 1;
                    }
                    else {
                      poVar7[1].parent = poVar10;
                      poVar7 = poVar7 + 2;
                    }
                    poVar10 = poVar10 + 1;
                    iVar11 = iVar11 + -2;
                  } while (2 < iVar11);
                }
                poVar3 = poVar9 + (int)OVar2;
                if (uVar4 == OVar1 - 1 || (uVar4 & 1) != 0) {
                  poVar3 = poVar10;
                  poVar9 = poVar10;
                }
                poVar10 = poVar9;
                poVar9 = poVar3;
                uVar4 = uVar4 + 1;
              } while (uVar4 != OVar1);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar15);
        }
        poVar7->parent = (opj_tgt_node *)0x0;
        pOVar13 = &__s->known;
        iVar11 = uVar12 + uVar8;
        do {
          *(undefined8 *)(pOVar13 + -2) = 999;
          *pOVar13 = 0;
          pOVar13 = pOVar13 + 6;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        return poVar5;
      }
      tgt_create_v2_cold_1();
    }
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create_v2(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv) {
	OPJ_INT32 nplh[32];
	OPJ_INT32 nplv[32];
	opj_tgt_node_t *node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	opj_tgt_tree_t *tree = 00;
	OPJ_UINT32 i;
	OPJ_INT32  j,k;
	OPJ_UINT32 numlvls;
	OPJ_UINT32 n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating tree\n");
		return 00;
	}
	memset(tree,0,sizeof(opj_tgt_tree_t));

	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);

	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		fprintf(stderr, "WARNING in tgt_create_v2 tree->numnodes == 0, no tree created.\n");
		return 00;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		fprintf(stderr, "ERROR in tgt_create_v2 while allocating node of the tree\n");
		opj_free(tree);
		return 00;
	}
	memset(tree->nodes,0,tree->numnodes * sizeof(opj_tgt_node_t));
	tree->nodes_size = tree->numnodes * sizeof(opj_tgt_node_t);

	node = tree->nodes;
	l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
	l_parent_node0 = l_parent_node;

	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = l_parent_node;
				++node;
				if (--k >= 0) {
					node->parent = l_parent_node;
					++node;
				}
				++l_parent_node;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				l_parent_node0 = l_parent_node;
			} else {
				l_parent_node = l_parent_node0;
				l_parent_node0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	tgt_reset(tree);
	return tree;
}